

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCompileFail.cpp
# Opt level: O2

void TEST_FOR_FAIL_FULL(char *name,char *str,char *error)

{
  nullres nVar1;
  int iVar2;
  char *__src;
  char buf [4096];
  char acStack_1018 [4095];
  undefined1 local_19;
  
  testsCount[4] = testsCount[4] + 1;
  nVar1 = nullcCompile(str);
  if (nVar1 != '\0') {
    printf("Test \"%s\" failed to fail.\r\n",name);
    return;
  }
  __src = nullcGetLastError();
  strncpy(acStack_1018,__src,0xfff);
  local_19 = 0;
  iVar2 = strcmp(error,acStack_1018);
  if (iVar2 == 0) {
    testsPassed[4] = testsPassed[4] + 1;
  }
  else {
    printf("Failed %s but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",name,acStack_1018,
           error);
  }
  return;
}

Assistant:

void TEST_FOR_FAIL_FULL(const char* name, const char* str, const char* error)
{
	testsCount[TEST_TYPE_FAILURE]++;
	nullres good = nullcCompile(str);
	if(!good)
	{
		char buf[4096];
		strncpy(buf, nullcGetLastError(), 4095); buf[4095] = 0;
		if(strcmp(error, buf) != 0)
		{
			printf("Failed %s but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", name, buf, error);
		}else{
			testsPassed[TEST_TYPE_FAILURE]++;
		}
	}else{
		printf("Test \"%s\" failed to fail.\r\n", name);
	}
}